

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

void __thiscall
google::protobuf::EncodedDescriptorDatabase::~EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  pointer ppvVar1;
  pointer ppvVar2;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__EncodedDescriptorDatabase_01691b38;
  ppvVar1 = (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppvVar2 = (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppvVar2 != ppvVar1; ppvVar2 = ppvVar2 + 1
      ) {
    operator_delete(*ppvVar2);
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&(this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::
  unique_ptr<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
  ::~unique_ptr(&this->index_);
  return;
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (void* p : files_to_delete_) {
    operator delete(p);
  }
}